

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,char *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *this_00;
  pointer *pppTVar1;
  int iVar2;
  iterator __position;
  iterator __position_00;
  bool bVar3;
  TestSuite *this_01;
  long *local_a8 [2];
  long local_98 [2];
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  local_88;
  undefined1 local_80 [32];
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  test_suite;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  TestSuite *local_40;
  TestSuite *new_test_suite;
  
  local_88.current._M_current =
       (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
        )(this->test_suites_).
         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  local_80._0_8_ =
       (this->test_suites_).
       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_80._8_8_ = type_param;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_suite,test_suite_name,(allocator<char> *)&local_40);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,
             CONCAT44(test_suite.current._M_current._4_4_,(int)test_suite.current._M_current),
             local_58 +
             CONCAT44(test_suite.current._M_current._4_4_,(int)test_suite.current._M_current));
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite**,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>>,testing::internal::TestSuiteNameIs>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)(local_80 + 0x18),&local_88,(TestSuiteNameIs *)local_80);
  local_80._16_8_ = set_up_tc;
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  this_00 = &this->test_suites_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(test_suite.current._M_current._4_4_,(int)test_suite.current._M_current) !=
      &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(test_suite.current._M_current._4_4_,
                                (int)test_suite.current._M_current),
                    local_50._M_allocated_capacity + 1);
  }
  if ((pointer)local_80._24_8_ ==
      (this_00->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    this_01 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite
              (this_01,test_suite_name,(char *)local_80._8_8_,(SetUpTestSuiteFunc)local_80._16_8_,
               tear_down_tc);
    local_40 = this_01;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_suite,test_suite_name,(allocator<char> *)((long)&new_test_suite + 7))
    ;
    bVar3 = UnitTestOptions::MatchesFilter((string *)&test_suite,"*DeathTest:*DeathTest/*");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(test_suite.current._M_current._4_4_,(int)test_suite.current._M_current) !=
        &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(test_suite.current._M_current._4_4_,
                                  (int)test_suite.current._M_current),
                      local_50._M_allocated_capacity + 1);
    }
    if (bVar3) {
      iVar2 = this->last_death_test_suite_;
      this->last_death_test_suite_ = iVar2 + 1;
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                (this_00,(const_iterator)
                         ((this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar2 + 1),&local_40);
    }
    else {
      __position._M_current =
           (this->test_suites_).
           super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->test_suites_).
          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>::
        _M_realloc_insert<testing::TestSuite*const&>
                  ((vector<testing::TestSuite*,std::allocator<testing::TestSuite*>> *)this_00,
                   __position,&local_40);
      }
      else {
        *__position._M_current = local_40;
        pppTVar1 = &(this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
    }
    __position_00._M_current =
         (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    test_suite.current._M_current._0_4_ =
         (int)((ulong)((long)__position_00._M_current -
                      (long)(this->test_suite_indices_).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    if (__position_00._M_current ==
        (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->test_suite_indices_,__position_00,(int *)&test_suite);
    }
    else {
      *__position_00._M_current = (int)test_suite.current._M_current;
      (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
  }
  else {
    local_40 = *(pointer)(local_80._24_8_ + -8);
  }
  return local_40;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const char* test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // Can we find a TestSuite with the given name?
  const auto test_suite =
      std::find_if(test_suites_.rbegin(), test_suites_.rend(),
                   TestSuiteNameIs(test_suite_name));

  if (test_suite != test_suites_.rend()) return *test_suite;

  // No.  Let's create one.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test suite?
  if (internal::UnitTestOptions::MatchesFilter(test_suite_name,
                                               kDeathTestSuiteFilter)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}